

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

void GenerateMixingConstants(void)

{
  byte bVar1;
  bool bVar2;
  uint32_t v;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  Rand r;
  uint8_t match [256];
  uint local_150;
  uint local_14c;
  Rand local_148;
  char local_138 [264];
  
  Rand::reseed(&local_148,0x7f69c3);
  uVar9 = 0;
  uVar10 = 0;
  local_150 = 0;
  local_14c = 0;
  uVar7 = 0;
  iVar6 = 0;
LAB_001666dd:
  do {
    do {
      if (99 < iVar6) {
        printf("%d %d %d %d %d %d\n",(ulong)uVar7,(ulong)uVar10,(ulong)uVar9,(ulong)local_150,
               (ulong)local_14c,iVar6);
        return;
      }
      v = Rand::rand_u32(&local_148);
      uVar3 = popcount(v);
      if (uVar3 < 0x10) {
        v = 0;
      }
      uVar4 = popcount(v);
      uVar10 = uVar10 + (0x10 < uVar4) + (uint)(uVar3 < 0x10);
      uVar7 = uVar7 + 1;
    } while (0x10 < uVar4 || v == 0);
    iVar8 = 0;
    do {
      if (iVar8 == 0x20) {
        iVar8 = 0;
        local_138[0xc0] = '\0';
        local_138[0xc1] = '\0';
        local_138[0xc2] = '\0';
        local_138[0xc3] = '\0';
        local_138[0xc4] = '\0';
        local_138[0xc5] = '\0';
        local_138[0xc6] = '\0';
        local_138[199] = '\0';
        local_138[200] = '\0';
        local_138[0xc9] = '\0';
        local_138[0xca] = '\0';
        local_138[0xcb] = '\0';
        local_138[0xcc] = '\0';
        local_138[0xcd] = '\0';
        local_138[0xce] = '\0';
        local_138[0xcf] = '\0';
        local_138[0xd0] = '\0';
        local_138[0xd1] = '\0';
        local_138[0xd2] = '\0';
        local_138[0xd3] = '\0';
        local_138[0xd4] = '\0';
        local_138[0xd5] = '\0';
        local_138[0xd6] = '\0';
        local_138[0xd7] = '\0';
        local_138[0xd8] = '\0';
        local_138[0xd9] = '\0';
        local_138[0xda] = '\0';
        local_138[0xdb] = '\0';
        local_138[0xdc] = '\0';
        local_138[0xdd] = '\0';
        local_138[0xde] = '\0';
        local_138[0xdf] = '\0';
        local_138[0xe0] = '\0';
        local_138[0xe1] = '\0';
        local_138[0xe2] = '\0';
        local_138[0xe3] = '\0';
        local_138[0xe4] = '\0';
        local_138[0xe5] = '\0';
        local_138[0xe6] = '\0';
        local_138[0xe7] = '\0';
        local_138[0xe8] = '\0';
        local_138[0xe9] = '\0';
        local_138[0xea] = '\0';
        local_138[0xeb] = '\0';
        local_138[0xec] = '\0';
        local_138[0xed] = '\0';
        local_138[0xee] = '\0';
        local_138[0xef] = '\0';
        local_138[0xf0] = '\0';
        local_138[0xf1] = '\0';
        local_138[0xf2] = '\0';
        local_138[0xf3] = '\0';
        local_138[0xf4] = '\0';
        local_138[0xf5] = '\0';
        local_138[0xf6] = '\0';
        local_138[0xf7] = '\0';
        local_138[0xf8] = '\0';
        local_138[0xf9] = '\0';
        local_138[0xfa] = '\0';
        local_138[0xfb] = '\0';
        local_138[0xfc] = '\0';
        local_138[0xfd] = '\0';
        local_138[0xfe] = '\0';
        local_138[0xff] = '\0';
        local_138[0x80] = '\0';
        local_138[0x81] = '\0';
        local_138[0x82] = '\0';
        local_138[0x83] = '\0';
        local_138[0x84] = '\0';
        local_138[0x85] = '\0';
        local_138[0x86] = '\0';
        local_138[0x87] = '\0';
        local_138[0x88] = '\0';
        local_138[0x89] = '\0';
        local_138[0x8a] = '\0';
        local_138[0x8b] = '\0';
        local_138[0x8c] = '\0';
        local_138[0x8d] = '\0';
        local_138[0x8e] = '\0';
        local_138[0x8f] = '\0';
        local_138[0x90] = '\0';
        local_138[0x91] = '\0';
        local_138[0x92] = '\0';
        local_138[0x93] = '\0';
        local_138[0x94] = '\0';
        local_138[0x95] = '\0';
        local_138[0x96] = '\0';
        local_138[0x97] = '\0';
        local_138[0x98] = '\0';
        local_138[0x99] = '\0';
        local_138[0x9a] = '\0';
        local_138[0x9b] = '\0';
        local_138[0x9c] = '\0';
        local_138[0x9d] = '\0';
        local_138[0x9e] = '\0';
        local_138[0x9f] = '\0';
        local_138[0xa0] = '\0';
        local_138[0xa1] = '\0';
        local_138[0xa2] = '\0';
        local_138[0xa3] = '\0';
        local_138[0xa4] = '\0';
        local_138[0xa5] = '\0';
        local_138[0xa6] = '\0';
        local_138[0xa7] = '\0';
        local_138[0xa8] = '\0';
        local_138[0xa9] = '\0';
        local_138[0xaa] = '\0';
        local_138[0xab] = '\0';
        local_138[0xac] = '\0';
        local_138[0xad] = '\0';
        local_138[0xae] = '\0';
        local_138[0xaf] = '\0';
        local_138[0xb0] = '\0';
        local_138[0xb1] = '\0';
        local_138[0xb2] = '\0';
        local_138[0xb3] = '\0';
        local_138[0xb4] = '\0';
        local_138[0xb5] = '\0';
        local_138[0xb6] = '\0';
        local_138[0xb7] = '\0';
        local_138[0xb8] = '\0';
        local_138[0xb9] = '\0';
        local_138[0xba] = '\0';
        local_138[0xbb] = '\0';
        local_138[0xbc] = '\0';
        local_138[0xbd] = '\0';
        local_138[0xbe] = '\0';
        local_138[0xbf] = '\0';
        local_138[0x40] = '\0';
        local_138[0x41] = '\0';
        local_138[0x42] = '\0';
        local_138[0x43] = '\0';
        local_138[0x44] = '\0';
        local_138[0x45] = '\0';
        local_138[0x46] = '\0';
        local_138[0x47] = '\0';
        local_138[0x48] = '\0';
        local_138[0x49] = '\0';
        local_138[0x4a] = '\0';
        local_138[0x4b] = '\0';
        local_138[0x4c] = '\0';
        local_138[0x4d] = '\0';
        local_138[0x4e] = '\0';
        local_138[0x4f] = '\0';
        local_138[0x50] = '\0';
        local_138[0x51] = '\0';
        local_138[0x52] = '\0';
        local_138[0x53] = '\0';
        local_138[0x54] = '\0';
        local_138[0x55] = '\0';
        local_138[0x56] = '\0';
        local_138[0x57] = '\0';
        local_138[0x58] = '\0';
        local_138[0x59] = '\0';
        local_138[0x5a] = '\0';
        local_138[0x5b] = '\0';
        local_138[0x5c] = '\0';
        local_138[0x5d] = '\0';
        local_138[0x5e] = '\0';
        local_138[0x5f] = '\0';
        local_138[0x60] = '\0';
        local_138[0x61] = '\0';
        local_138[0x62] = '\0';
        local_138[99] = '\0';
        local_138[100] = '\0';
        local_138[0x65] = '\0';
        local_138[0x66] = '\0';
        local_138[0x67] = '\0';
        local_138[0x68] = '\0';
        local_138[0x69] = '\0';
        local_138[0x6a] = '\0';
        local_138[0x6b] = '\0';
        local_138[0x6c] = '\0';
        local_138[0x6d] = '\0';
        local_138[0x6e] = '\0';
        local_138[0x6f] = '\0';
        local_138[0x70] = '\0';
        local_138[0x71] = '\0';
        local_138[0x72] = '\0';
        local_138[0x73] = '\0';
        local_138[0x74] = '\0';
        local_138[0x75] = '\0';
        local_138[0x76] = '\0';
        local_138[0x77] = '\0';
        local_138[0x78] = '\0';
        local_138[0x79] = '\0';
        local_138[0x7a] = '\0';
        local_138[0x7b] = '\0';
        local_138[0x7c] = '\0';
        local_138[0x7d] = '\0';
        local_138[0x7e] = '\0';
        local_138[0x7f] = '\0';
        local_138[0] = '\0';
        local_138[1] = '\0';
        local_138[2] = '\0';
        local_138[3] = '\0';
        local_138[4] = '\0';
        local_138[5] = '\0';
        local_138[6] = '\0';
        local_138[7] = '\0';
        local_138[8] = '\0';
        local_138[9] = '\0';
        local_138[10] = '\0';
        local_138[0xb] = '\0';
        local_138[0xc] = '\0';
        local_138[0xd] = '\0';
        local_138[0xe] = '\0';
        local_138[0xf] = '\0';
        local_138[0x10] = '\0';
        local_138[0x11] = '\0';
        local_138[0x12] = '\0';
        local_138[0x13] = '\0';
        local_138[0x14] = '\0';
        local_138[0x15] = '\0';
        local_138[0x16] = '\0';
        local_138[0x17] = '\0';
        local_138[0x18] = '\0';
        local_138[0x19] = '\0';
        local_138[0x1a] = '\0';
        local_138[0x1b] = '\0';
        local_138[0x1c] = '\0';
        local_138[0x1d] = '\0';
        local_138[0x1e] = '\0';
        local_138[0x1f] = '\0';
        local_138[0x20] = '\0';
        local_138[0x21] = '\0';
        local_138[0x22] = '\0';
        local_138[0x23] = '\0';
        local_138[0x24] = '\0';
        local_138[0x25] = '\0';
        local_138[0x26] = '\0';
        local_138[0x27] = '\0';
        local_138[0x28] = '\0';
        local_138[0x29] = '\0';
        local_138[0x2a] = '\0';
        local_138[0x2b] = '\0';
        local_138[0x2c] = '\0';
        local_138[0x2d] = '\0';
        local_138[0x2e] = '\0';
        local_138[0x2f] = '\0';
        local_138[0x30] = '\0';
        local_138[0x31] = '\0';
        local_138[0x32] = '\0';
        local_138[0x33] = '\0';
        local_138[0x34] = '\0';
        local_138[0x35] = '\0';
        local_138[0x36] = '\0';
        local_138[0x37] = '\0';
        local_138[0x38] = '\0';
        local_138[0x39] = '\0';
        local_138[0x3a] = '\0';
        local_138[0x3b] = '\0';
        local_138[0x3c] = '\0';
        local_138[0x3d] = '\0';
        local_138[0x3e] = '\0';
        local_138[0x3f] = '\0';
        goto LAB_001667a2;
      }
      bVar1 = (byte)iVar8 & 0x1f;
      uVar5 = (v << bVar1 | v >> 0x20 - bVar1) & 0xff;
      uVar3 = popcount(uVar5);
      if (uVar3 < 3) break;
      uVar3 = popcount(uVar5);
      iVar8 = iVar8 + 1;
    } while (uVar3 < 6);
    uVar9 = uVar9 + 1;
  } while( true );
LAB_001667a2:
  if (iVar8 == 0x20) goto LAB_001667be;
  bVar1 = (byte)iVar8 & 0x1f;
  uVar5 = (v << bVar1 | v >> 0x20 - bVar1) & 0xff;
  if (local_138[uVar5] != '\0') {
    local_150 = local_150 + 1;
    goto LAB_001666dd;
  }
  local_138[uVar5] = '\x01';
  iVar8 = iVar8 + 1;
  goto LAB_001667a2;
LAB_001667be:
  bVar2 = isprime(v);
  local_14c = local_14c + !bVar2;
  if (bVar2) {
    printf("0x%08x : 0x%08x\n",(ulong)v,(ulong)~v);
    iVar6 = iVar6 + 1;
  }
  goto LAB_001666dd;
}

Assistant:

void GenerateMixingConstants ( void )
{
  Rand r(8350147);

  int count = 0;

  int trials = 0;
  int bitfail = 0;
  int popfail = 0;
  int matchfail = 0;
  int primefail = 0;

  //for(uint32_t x = 1; x; x++)
  while(count < 100)
  {
    //if(x % 100000000 == 0) printf(".");

    trials++;
    uint32_t b = r.rand_u32();
    //uint32_t b = x;

    //----------
    // must have between 14 and 18 set bits

    if(popcount(b) < 16) { b = 0; popfail++; }
    if(popcount(b) > 16) { b = 0; popfail++; }

    if(b == 0) continue;

    //----------
    // must have 3-5 bits set per 8-bit window

    for(int i = 0; i < 32; i++)
    {
      uint32_t c = ROTL32(b,i) & 0xFF;

      if(popcount(c) < 3) { b = 0; bitfail++; break; }
      if(popcount(c) > 5) { b = 0; bitfail++; break; }
    }

    if(b == 0) continue;

    //----------
    // all 8-bit windows must be different

    uint8_t match[256];

    memset(match,0,256);

    for(int i = 0; i < 32; i++)
    {
      uint32_t c = ROTL32(b,i) & 0xFF;
      
      if(match[c]) { b = 0; matchfail++; break; }

      match[c] = 1;
    }

    if(b == 0) continue;

    //----------
    // must be prime

    if(!isprime(b))
    {
      b = 0;
      primefail++;
    }

    if(b == 0) continue;

    //----------

    if(b)
    {
      printf("0x%08x : 0x%08x\n",b,~b);
      count++;
    }
  }

  printf("%d %d %d %d %d %d\n",trials,popfail,bitfail,matchfail,primefail,count);
}